

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O0

CK_STATE __thiscall Session::getState(Session *this)

{
  bool bVar1;
  Session *in_RDI;
  Token *in_stack_00000018;
  undefined8 local_8;
  
  bVar1 = Token::isSOLoggedIn(in_stack_00000018);
  if (bVar1) {
    local_8 = 4;
  }
  else {
    bVar1 = Token::isUserLoggedIn(in_stack_00000018);
    if (bVar1) {
      bVar1 = isRW(in_RDI);
      if (bVar1) {
        local_8 = 3;
      }
      else {
        local_8 = 1;
      }
    }
    else {
      bVar1 = isRW(in_RDI);
      if (bVar1) {
        local_8 = 2;
      }
      else {
        local_8 = 0;
      }
    }
  }
  return local_8;
}

Assistant:

CK_STATE Session::getState()
{
	if (token->isSOLoggedIn())
	{
		return CKS_RW_SO_FUNCTIONS;
	}

	if (token->isUserLoggedIn())
	{
		if (isRW())
		{
			return CKS_RW_USER_FUNCTIONS;
		}
		else
		{
			return CKS_RO_USER_FUNCTIONS;
		}
	}

	if (isRW())
	{
		return CKS_RW_PUBLIC_SESSION;
	}
	else
	{
		return CKS_RO_PUBLIC_SESSION;
	}
}